

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainReal.c
# Opt level: O2

int Abc_RealMain(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Vec_Str_t *p;
  char *pcVar9;
  Abc_Frame_t *pAbc;
  Gia_Man_t *pGVar10;
  __rlimit_resource_t __resource;
  Vec_Str_t *pVVar11;
  char *local_8828;
  Vec_Str_t *sCommandUsr;
  char sWriteCmd [1000];
  char sReadCmd [1000];
  char sCommandTmp [32768];
  
  p = (Vec_Str_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  pcVar9 = (char *)malloc(1000);
  p->pArray = pcVar9;
  sCommandUsr = p;
  pAbc = Abc_FrameGetGlobalFrame();
  pAbc->sBinary = *argv;
  builtin_strncpy(sReadCmd,"read",5);
  builtin_strncpy(sWriteCmd,"write",6);
  Extra_UtilGetoptReset();
  bVar2 = false;
  bVar3 = false;
  iVar6 = 0;
  local_8828 = (char *)0x0;
  bVar4 = true;
switchD_001c9ee7_caseD_73:
  bVar1 = bVar4;
  iVar5 = Extra_UtilGetopt(argc,argv,"dm:l:c:q:C:Q:S:hf:F:o:st:T:xb");
  bVar4 = false;
  switch(iVar5) {
  case 0x62:
    Abc_FrameSetBridgeMode();
    bVar4 = bVar1;
    goto switchD_001c9ee7_caseD_73;
  case 99:
    if (0 < p->nSize) {
      Vec_StrAppend(p," ; ");
    }
    Vec_StrAppend(p,globalUtilOptarg);
    break;
  case 100:
    enable_dbg_outs._0_1_ = (byte)enable_dbg_outs ^ 1;
    bVar4 = bVar1;
    goto switchD_001c9ee7_caseD_73;
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6e:
  case 0x70:
  case 0x72:
  case 0x75:
  case 0x76:
  case 0x77:
    goto switchD_001c9ee7_caseD_65;
  case 0x66:
    if (0 < p->nSize) {
      Vec_StrAppend(p," ; ");
    }
    pcVar9 = "source %s";
LAB_001ca1bc:
    Vec_StrPrintF(p,pcVar9,globalUtilOptarg);
    break;
  case 0x6c:
    uVar8 = atoi(globalUtilOptarg);
    printf("Limiting time to %d seconds\n",(ulong)uVar8);
    __resource = RLIMIT_CPU;
    sCommandTmp._8_8_ = (long)(int)uVar8;
    goto LAB_001ca0c6;
  case 0x6d:
    uVar8 = atoi(globalUtilOptarg);
    printf("Limiting memory use to %d MB\n",(ulong)uVar8);
    __resource = RLIMIT_AS;
    sCommandTmp._8_8_ = (long)(int)uVar8 << 0x14;
LAB_001ca0c6:
    sCommandTmp._0_8_ = sCommandTmp._8_8_;
    setrlimit(__resource,(rlimit *)sCommandTmp);
    bVar4 = bVar1;
    goto switchD_001c9ee7_caseD_73;
  case 0x6f:
    local_8828 = globalUtilOptarg;
    bVar3 = true;
    bVar4 = bVar1;
    goto switchD_001c9ee7_caseD_73;
  case 0x71:
    if (0 < p->nSize) {
      Vec_StrAppend(p," ; ");
    }
    Vec_StrAppend(p,globalUtilOptarg);
    iVar6 = 3;
    bVar4 = bVar1;
  case 0x73:
    goto switchD_001c9ee7_caseD_73;
  case 0x74:
    iVar6 = TypeCheck(pAbc,globalUtilOptarg);
    pcVar9 = globalUtilOptarg;
    if (iVar6 == 0) goto switchD_001c9ee7_caseD_65;
    iVar5 = strcmp(globalUtilOptarg,"none");
    iVar6 = 1;
    bVar4 = bVar1;
    if (iVar5 != 0) {
      sprintf(sReadCmd,"read_%s",pcVar9);
      bVar2 = true;
      iVar6 = 1;
    }
    goto switchD_001c9ee7_caseD_73;
  case 0x78:
    bVar2 = false;
    bVar3 = false;
    break;
  default:
    if (iVar5 == 0x43) {
      if (0 < p->nSize) {
        Vec_StrAppend(p," ; ");
      }
      Vec_StrAppend(p,globalUtilOptarg);
      iVar6 = 2;
      bVar4 = bVar1;
    }
    else {
      if (iVar5 == 0x46) {
        if (0 < p->nSize) {
          Vec_StrAppend(p," ; ");
        }
        pcVar9 = "source -x %s";
        goto LAB_001ca1bc;
      }
      if (iVar5 == 0x51) {
        if (0 < p->nSize) {
          Vec_StrAppend(p," ; ");
        }
        Vec_StrAppend(p,globalUtilOptarg);
        iVar6 = 4;
        bVar4 = bVar1;
      }
      else {
        if (iVar5 != 0x53) {
          if (iVar5 == 0x54) {
            iVar6 = TypeCheck(pAbc,globalUtilOptarg);
            pcVar9 = globalUtilOptarg;
            if (iVar6 != 0) goto code_r0x001c9f3d;
          }
          else if (iVar5 == -1) {
            pcVar9 = (char *)0x0;
            pVVar11 = p;
            Vec_StrPush(p,'\0');
            iVar5 = (int)pVVar11;
            if (iVar6 == 5) {
              Wlc_StdinProcessSmt(pAbc,p->pArray);
              goto LAB_001ca445;
            }
            iVar7 = Abc_FrameIsBridgeMode();
            if (iVar7 == 0) {
              if (iVar6 - 3U < 2) goto LAB_001ca2c0;
              if (iVar6 != 0) {
                if (0 < p->nSize) {
                  Abc_Print(iVar5,pcVar9,p->pArray);
                }
                goto LAB_001ca2ad;
              }
            }
            else {
              pGVar10 = Gia_ManFromBridge((FILE *)_stdin,(Vec_Int_t **)0x0);
              pAbc->pGia = pGVar10;
LAB_001ca2ad:
              if (iVar6 != 0) {
LAB_001ca2c0:
                pAbc->fBatchMode = 1;
                if (argc == globalUtilOptind) {
                  pcVar9 = (char *)0x0;
                }
                else if (argc - globalUtilOptind == 1) {
                  pcVar9 = argv[globalUtilOptind];
                  bVar2 = true;
                }
                else {
                  Abc_UtilsPrintUsage(pAbc,*argv);
                  pcVar9 = (char *)0x0;
                }
                if (bVar1) {
                  Abc_UtilsSource(pAbc);
                }
                if ((bVar2) && (pcVar9 != (char *)0x0)) {
                  sprintf(sCommandTmp,"%s %s",sReadCmd,pcVar9);
                  iVar5 = Cmd_CommandExecute(pAbc,sCommandTmp);
                  if (iVar5 == 0) goto LAB_001ca372;
                }
                else {
LAB_001ca372:
                  iVar5 = Cmd_CommandExecute(pAbc,p->pArray);
                  if ((local_8828 != (char *)0x0 && bVar3) && iVar5 + 1U < 2) {
                    sprintf(sCommandTmp,"%s %s",sWriteCmd,local_8828);
                    Cmd_CommandExecute(pAbc,sCommandTmp);
                  }
                }
                if ((iVar6 != 4) && (iVar6 != 2)) {
                  Vec_StrFreeP(&sCommandUsr);
                  goto LAB_001ca445;
                }
                pAbc->fBatchMode = 0;
              }
            }
            Vec_StrFreeP(&sCommandUsr);
            Abc_UtilsPrintHello(pAbc);
            Cmd_HistoryPrint(pAbc,10);
            if (bVar1) {
              Abc_UtilsSource(pAbc);
            }
            goto LAB_001ca413;
          }
          goto switchD_001c9ee7_caseD_65;
        }
        if (0 < p->nSize) {
          Vec_StrAppend(p," ; ");
        }
        Vec_StrAppend(p,globalUtilOptarg);
        iVar6 = 5;
        bVar4 = bVar1;
      }
    }
    goto switchD_001c9ee7_caseD_73;
  }
  iVar6 = 1;
  bVar4 = bVar1;
  goto switchD_001c9ee7_caseD_73;
code_r0x001c9f3d:
  iVar5 = strcmp(globalUtilOptarg,"none");
  iVar6 = 1;
  bVar4 = bVar1;
  if (iVar5 != 0) {
    sprintf(sWriteCmd,"write_%s",pcVar9);
    bVar3 = true;
    iVar6 = 1;
  }
  goto switchD_001c9ee7_caseD_73;
switchD_001c9ee7_caseD_65:
  Abc_UtilsPrintHello(pAbc);
  Abc_UtilsPrintUsage(pAbc,*argv);
  return 1;
  while( true ) {
    pcVar9 = Abc_UtilsGetUsersInput(pAbc);
    uVar8 = Cmd_CommandExecute(pAbc,pcVar9);
    if (0xfffffffd < uVar8) break;
LAB_001ca413:
    iVar6 = feof(_stdin);
    if (iVar6 != 0) break;
  }
LAB_001ca445:
  Abc_Stop();
  return 0;
}

Assistant:

int Abc_RealMain( int argc, char * argv[] )
{
    Abc_Frame_t * pAbc;
    Vec_Str_t* sCommandUsr = Vec_StrAlloc(1000);
    char sCommandTmp[ABC_MAX_STR], sReadCmd[1000], sWriteCmd[1000];
    const char * sOutFile, * sInFile;
    char * sCommand;
    int  fStatus = 0;
    int c, fInitSource, fInitRead, fFinalWrite;

    enum {
        INTERACTIVE, // interactive mode
        BATCH, // batch mode, run a command and quit
        BATCH_THEN_INTERACTIVE, // run a command, then back to interactive mode
        BATCH_QUIET, // as in batch mode, but don't echo the command
        BATCH_QUIET_THEN_INTERACTIVE, // as in batch then interactive mode, but don't echo the command
        BATCH_SMT // special batch mode, which expends SMTLIB problem via stdin
    } fBatch;

    // added to detect memory leaks
    // watch for {,,msvcrtd.dll}*__p__crtBreakAlloc()
    // (http://support.microsoft.com/kb/151585)
#if defined(_DEBUG) && defined(_MSC_VER)
    _CrtSetDbgFlag( _CRTDBG_ALLOC_MEM_DF | _CRTDBG_LEAK_CHECK_DF );
#endif

    // get global frame (singleton pattern)
    // will be initialized on first call
    pAbc = Abc_FrameGetGlobalFrame();
    pAbc->sBinary = argv[0];

    // default options
    fBatch      = INTERACTIVE;
    fInitSource = 1;
    fInitRead   = 0;
    fFinalWrite = 0;
    sInFile = sOutFile = NULL;
    sprintf( sReadCmd,  "read"  );
    sprintf( sWriteCmd, "write" );

    Extra_UtilGetoptReset();
    while ((c = Extra_UtilGetopt(argc, argv, "dm:l:c:q:C:Q:S:hf:F:o:st:T:xb")) != EOF) {
        switch(c) {

            case 'd':                                          
                enable_dbg_outs ^= 1;                            
                break;                                          

            case 'm': {
#if !defined(WIN32) && !defined(ABC_NO_RLIMIT)
                int maxMb = atoi(globalUtilOptarg);             
                printf("Limiting memory use to %d MB\n", maxMb);
                struct rlimit limit = {                         
                    maxMb * (1llu << 20), /* soft limit */      
                    maxMb * (1llu << 20)  /* hard limit */      
                };                                              
                setrlimit(RLIMIT_AS, &limit);                   
#endif
                break; 
            }                                         
            case 'l': {
#if !defined(WIN32) && !defined(ABC_NO_RLIMIT)
                rlim_t maxTime = atoi(globalUtilOptarg);           
                printf("Limiting time to %d seconds\n", (int)maxTime);
                struct rlimit limit = {                         
                    maxTime,             /* soft limit */       
                    maxTime              /* hard limit */       
                };                                              
                setrlimit(RLIMIT_CPU, &limit);                  
#endif
                break; 
            }                                         
            case 'c':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrAppend(sCommandUsr, globalUtilOptarg );
                fBatch = BATCH;
                break;

            case 'q':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrAppend(sCommandUsr, globalUtilOptarg );
                fBatch = BATCH_QUIET;
                break;

            case 'Q':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrAppend(sCommandUsr, globalUtilOptarg );
                fBatch = BATCH_QUIET_THEN_INTERACTIVE;
                break;

            case 'C':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrAppend(sCommandUsr, globalUtilOptarg );
                fBatch = BATCH_THEN_INTERACTIVE;
                break;

            case 'S':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrAppend(sCommandUsr, globalUtilOptarg );
                fBatch = BATCH_SMT;
                break;

            case 'f':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrPrintF(sCommandUsr, "source %s", globalUtilOptarg );
                fBatch = BATCH;
                break;

            case 'F':
                if( Vec_StrSize(sCommandUsr) > 0 )
                {
                    Vec_StrAppend(sCommandUsr, " ; ");
                }
                Vec_StrPrintF(sCommandUsr, "source -x %s", globalUtilOptarg );
                fBatch = BATCH;
                break;

            case 'h':
                goto usage;
                break;

            case 'o':
                sOutFile = globalUtilOptarg;
                fFinalWrite = 1;
                break;

            case 's':
                fInitSource = 0;
                break;

            case 't':
                if ( TypeCheck( pAbc, globalUtilOptarg ) )
                {
                    if ( (!strcmp(globalUtilOptarg, "none")) == 0 )
                    {
                        fInitRead = 1;
                        sprintf( sReadCmd, "read_%s", globalUtilOptarg );
                    }
                }
                else {
                    goto usage;
                }
                fBatch = BATCH;
                break;

            case 'T':
                if ( TypeCheck( pAbc, globalUtilOptarg ) )
                {
                    if ( (!strcmp(globalUtilOptarg, "none")) == 0)
                    {
                        fFinalWrite = 1;
                        sprintf( sWriteCmd, "write_%s", globalUtilOptarg);
                    }
                }
                else {
                    goto usage;
                }
                fBatch = BATCH;
                break;

            case 'x':
                fFinalWrite = 0;
                fInitRead   = 0;
                fBatch = BATCH;
                break;

            case 'b':
                Abc_FrameSetBridgeMode();
                break;

            default:
                goto usage;
        }
    }

    Vec_StrPush(sCommandUsr, '\0');

    if ( fBatch == BATCH_SMT )
    {
        Wlc_StdinProcessSmt( pAbc, Vec_StrArray(sCommandUsr) );
        Abc_Stop();
        return 0;
    }

    if ( Abc_FrameIsBridgeMode() )
    {
        extern Gia_Man_t * Gia_ManFromBridge( FILE * pFile, Vec_Int_t ** pvInit );
        pAbc->pGia = Gia_ManFromBridge( stdin, NULL );
    }
    else if ( fBatch!=INTERACTIVE && fBatch!=BATCH_QUIET && fBatch!=BATCH_QUIET_THEN_INTERACTIVE && Vec_StrSize(sCommandUsr)>0 )
        Abc_Print( 1, "ABC command line: \"%s\".\n\n", Vec_StrArray(sCommandUsr) );

    if ( fBatch!=INTERACTIVE )
    {
        pAbc->fBatchMode = 1;

        if (argc - globalUtilOptind == 0)
        {
            sInFile = NULL;
        }
        else if (argc - globalUtilOptind == 1)
        {
            fInitRead = 1;
            sInFile = argv[globalUtilOptind];
        }
        else
        {
            Abc_UtilsPrintUsage( pAbc, argv[0] );
        }

        // source the resource file
        if ( fInitSource )
        {
            Abc_UtilsSource( pAbc );
        }

        fStatus = 0;
        if ( fInitRead && sInFile )
        {
            sprintf( sCommandTmp, "%s %s", sReadCmd, sInFile );
            fStatus = Cmd_CommandExecute( pAbc, sCommandTmp );
        }

        if ( fStatus == 0 )
        {
            /* cmd line contains `source <file>' */
            fStatus = Cmd_CommandExecute( pAbc, Vec_StrArray(sCommandUsr) );
            if ( (fStatus == 0 || fStatus == -1) && fFinalWrite && sOutFile )
            {
                sprintf( sCommandTmp, "%s %s", sWriteCmd, sOutFile );
                fStatus = Cmd_CommandExecute( pAbc, sCommandTmp );
            }
        }

        if (fBatch == BATCH_THEN_INTERACTIVE || fBatch == BATCH_QUIET_THEN_INTERACTIVE){
            fBatch = INTERACTIVE;
            pAbc->fBatchMode = 0;
        }
    }

    Vec_StrFreeP(&sCommandUsr);

    if ( fBatch==INTERACTIVE )
    {
        // start interactive mode

        // print the hello line
        Abc_UtilsPrintHello( pAbc );
        // print history of the recent commands
        Cmd_HistoryPrint( pAbc, 10 );

        // source the resource file
        if ( fInitSource )
        {
            Abc_UtilsSource( pAbc );
        }

        // execute commands given by the user
        while ( !feof(stdin) )
        {
            // print command line prompt and
            // get the command from the user
            sCommand = Abc_UtilsGetUsersInput( pAbc );

            // execute the user's command
            fStatus = Cmd_CommandExecute( pAbc, sCommand );

            // stop if the user quitted or an error occurred
            if ( fStatus == -1 || fStatus == -2 )
                break;
        }
    }

    // if the memory should be freed, quit packages
//    if ( fStatus < 0 ) 
    {
        Abc_Stop();
    }
    return 0;

usage:
    Abc_UtilsPrintHello( pAbc );
    Abc_UtilsPrintUsage( pAbc, argv[0] );
    return 1;
}